

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::UnicodeSet::complement(UnicodeSet *this)

{
  int iVar1;
  uint in_EAX;
  ulong uStack_18;
  UErrorCode status;
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    uStack_18 = (ulong)in_EAX;
    if (*this->list == 0) {
      ensureBufferCapacity(this,this->len + -1,&status);
      if (U_ZERO_ERROR < status) {
        return this;
      }
      memcpy(this->buffer,this->list + 1,(long)this->len * 4 - 4);
      iVar1 = -1;
    }
    else {
      ensureBufferCapacity(this,this->len + 1,&status);
      if (U_ZERO_ERROR < status) {
        return this;
      }
      memcpy(this->buffer + 1,this->list,(long)this->len << 2);
      *this->buffer = 0;
      iVar1 = 1;
    }
    this->len = this->len + iVar1;
    swapBuffers(this);
    releasePattern(this);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complement(void) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    UErrorCode status = U_ZERO_ERROR;
    if (list[0] == UNICODESET_LOW) {
        ensureBufferCapacity(len-1, status);
        if (U_FAILURE(status)) {
            return *this;
        }
        uprv_memcpy(buffer, list + 1, (size_t)(len-1)*sizeof(UChar32));
        --len;
    } else {
        ensureBufferCapacity(len+1, status);
        if (U_FAILURE(status)) {
            return *this;
        }
        uprv_memcpy(buffer + 1, list, (size_t)len*sizeof(UChar32));
        buffer[0] = UNICODESET_LOW;
        ++len;
    }
    swapBuffers();
    releasePattern();
    return *this;
}